

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_money.cpp
# Opt level: O0

money_t * money_new(int amount,char *currency)

{
  money_t *self;
  char *currency_local;
  money_t *pmStack_10;
  int amount_local;
  
  pmStack_10 = (money_t *)calloc(1,0x14);
  if (pmStack_10 == (money_t *)0x0) {
    pmStack_10 = (money_t *)0x0;
  }
  else {
    strcpy(pmStack_10->currency,currency);
    pmStack_10->currency[0xf] = '\0';
    pmStack_10->amount = amount;
  }
  return pmStack_10;
}

Assistant:

static money_t *
money_new(int amount, char const *currency)
{
    money_t *self =NULL;

    self = (money_t*)calloc(1, sizeof(money_t));
    if ( self == NULL )
    {
        return NULL;
    }

    strcpy(self->currency, currency);
    self->currency[MONEY_MAX_CURR_LEN-1] = '\0';

    self->amount = amount;

    return self;
}